

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivially_serializable.cpp
# Opt level: O0

void __thiscall handlegraph::TriviallySerializable::close_fd(TriviallySerializable *this,int fd)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  runtime_error *this_00;
  int in_ESI;
  stringstream ss;
  int problem;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  int local_10;
  
  iVar1 = close(in_ESI);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    local_10 = *piVar2;
    std::__cxx11::stringstream::stringstream(local_198);
    poVar3 = std::operator<<(local_188,"Could not close FD: ");
    pcVar4 = strerror(local_10);
    std::operator<<(poVar3,pcVar4);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1c8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void TriviallySerializable::close_fd(int fd) const {
    // Close up the file
    if (::close(fd) != 0) {
        // An error happened closing
        auto problem = errno;
        std::stringstream ss;
        ss << "Could not close FD: " << ::strerror(problem);
        throw std::runtime_error(ss.str());
    }
}